

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen_Capture_Example.cpp
# Opt level: O1

vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *
getWindowToCapture(vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>
                   *__return_storage_ptr__,string *window_to_search_for)

{
  char *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  iterator __position;
  long *plVar4;
  char cVar5;
  undefined1 uVar6;
  ctype *pcVar7;
  size_t sVar8;
  long lVar9;
  ostream *poVar10;
  size_type sVar11;
  long lVar12;
  Window *pWVar13;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *filtereditems;
  string name;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> windows;
  long *local_90;
  long local_88;
  long local_80 [2];
  string *local_70;
  Window *local_68;
  Window *local_60;
  long local_58;
  Window *local_50;
  char *local_48;
  Window *local_40;
  locale local_38 [8];
  
  SL::Screen_Capture::GetWindows();
  sVar2 = window_to_search_for->_M_string_length;
  local_70 = window_to_search_for;
  if (sVar2 != 0) {
    pcVar3 = (window_to_search_for->_M_dataplus)._M_p;
    sVar11 = 0;
    do {
      cVar5 = pcVar3[sVar11];
      std::locale::locale((locale *)&local_90);
      pcVar7 = std::use_facet<std::ctype<char>>((locale *)&local_90);
      cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
      std::locale::~locale((locale *)&local_90);
      pcVar3[sVar11] = cVar5;
      sVar11 = sVar11 + 1;
    } while (sVar2 != sVar11);
  }
  (__return_storage_ptr__->
  super__Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = local_60;
  if (local_68 != local_60) {
    pWVar13 = local_68;
    do {
      local_90 = local_80;
      pcVar1 = pWVar13->Name;
      sVar8 = strlen(pcVar1);
      local_48 = pcVar1;
      local_40 = pWVar13;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,pcVar1,pWVar13->Name + sVar8);
      lVar9 = local_88;
      plVar4 = local_90;
      if (local_88 != 0) {
        lVar12 = 0;
        do {
          cVar5 = *(char *)((long)plVar4 + lVar12);
          std::locale::locale(local_38);
          pcVar7 = std::use_facet<std::ctype<char>>(local_38);
          uVar6 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
          std::locale::~locale(local_38);
          *(undefined1 *)((long)plVar4 + lVar12) = uVar6;
          lVar12 = lVar12 + 1;
        } while (lVar9 != lVar12);
      }
      lVar9 = std::__cxx11::string::find((char *)&local_90,(ulong)(local_70->_M_dataplus)._M_p,0);
      pWVar13 = local_40;
      if (lVar9 != -1) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<SL::Screen_Capture::Window,std::allocator<SL::Screen_Capture::Window>>::
          _M_realloc_insert<SL::Screen_Capture::Window_const&>
                    ((vector<SL::Screen_Capture::Window,std::allocator<SL::Screen_Capture::Window>>
                      *)__return_storage_ptr__,__position,local_40);
        }
        else {
          memcpy(__position._M_current,local_40,0x98);
          (__return_storage_ptr__->
          super__Vector_base<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>
          )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ADDING WINDOW  Height ",0x16);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(pWVar13->Size).y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  Width  ",9);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,(pWVar13->Size).x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"   ",3);
        pcVar1 = local_48;
        sVar8 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar1,sVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      pWVar13 = pWVar13 + 1;
    } while (pWVar13 != local_50);
  }
  if (local_68 != (Window *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

auto getWindowToCapture(std::string window_to_search_for = "blizzard")
{
    auto windows = SL::Screen_Capture::GetWindows(); 
    // convert to lower case for easier comparisons
    std::transform(window_to_search_for.begin(), window_to_search_for.end(), window_to_search_for.begin(),
                   [](char c) { return std::tolower(c, std::locale()); });
    decltype(windows) filtereditems;
    for (auto &a : windows) {
        std::string name = a.Name;
        std::transform(name.begin(), name.end(), name.begin(), [](char c) { return std::tolower(c, std::locale()); });
        if (name.find(window_to_search_for) != std::string::npos) {
            filtereditems.push_back(a);
            std::cout << "ADDING WINDOW  Height " << a.Size.y << "  Width  " << a.Size.x << "   " << a.Name << std::endl;
        }
    }

    return filtereditems;
}